

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O0

void Msat_HeapPercolateDown(Msat_Order_t *p,int i)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int local_1c;
  int Child;
  int x;
  int i_local;
  Msat_Order_t *p_local;
  
  iVar3 = p->vHeap->pArray[i];
  Child = i;
  while (Child * 2 < p->vHeap->nSize) {
    if ((p->vHeap->nSize <= Child * 2 + 1) ||
       (dVar2 = p->pSat->pdActivity[p->vHeap->pArray[Child * 2 + 1]],
       pdVar1 = p->pSat->pdActivity + p->vHeap->pArray[Child << 1],
       dVar2 < *pdVar1 || dVar2 == *pdVar1)) {
      local_1c = Child << 1;
    }
    else {
      local_1c = Child * 2 + 1;
    }
    dVar2 = p->pSat->pdActivity[p->vHeap->pArray[local_1c]];
    pdVar1 = p->pSat->pdActivity + iVar3;
    if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
    p->vHeap->pArray[Child] = p->vHeap->pArray[local_1c];
    p->vIndex->pArray[p->vHeap->pArray[Child]] = Child;
    Child = local_1c;
  }
  p->vHeap->pArray[Child] = iVar3;
  p->vIndex->pArray[iVar3] = Child;
  return;
}

Assistant:

void Msat_HeapPercolateDown( Msat_Order_t * p, int i )
{
    int x = HHEAP(p, i);
    int Child;
    while ( HLEFT(i) < HSIZE(p) )
    {
        if ( HRIGHT(i) < HSIZE(p) && HCOMPARE(p, HHEAP(p, HRIGHT(i)), HHEAP(p, HLEFT(i))) )
            Child = HRIGHT(i);
        else
            Child = HLEFT(i);
        if ( !HCOMPARE(p, HHEAP(p, Child), x) )
            break;
        p->vHeap->pArray[i]            = HHEAP(p, Child);
        p->vIndex->pArray[HHEAP(p, i)] = i;
        i                              = Child;
    }
    p->vHeap->pArray[i]  = x;
    p->vIndex->pArray[x] = i;
}